

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_code_domain.hpp
# Opt level: O0

bool __thiscall
system_error2::status_code_domain::_do_erased_copy
          (status_code_domain *this,status_code<void> *dst,status_code<void> *src,
          payload_info_t dstinfo)

{
  size_t local_58;
  size_t tocopy;
  payload_info_t srcinfo;
  status_code<void> *src_local;
  status_code<void> *dst_local;
  status_code_domain *this_local;
  
  srcinfo.total_alignment = (size_t)src;
  (*this->_vptr_status_code_domain[1])(&tocopy);
  if (dstinfo.total_size < srcinfo.payload_size) {
    this_local._7_1_ = false;
  }
  else {
    if (srcinfo.payload_size < dstinfo.total_size) {
      local_58 = srcinfo.payload_size;
    }
    else {
      local_58 = dstinfo.total_size;
    }
    memcpy(dst,(void *)srcinfo.total_alignment,local_58);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool _do_erased_copy(status_code<void> &dst, const status_code<void> &src, payload_info_t dstinfo) const
  {
    // Note that dst may not have its domain set
    const auto srcinfo = payload_info();
    if(dstinfo.total_size < srcinfo.total_size)
    {
      return false;
    }
    const auto tocopy = (dstinfo.total_size > srcinfo.total_size) ? srcinfo.total_size : dstinfo.total_size;
    memcpy(&dst, &src, tocopy);
    return true;
  }